

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Naming.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
ArrVarName(QAM *tam,string *prefix)

{
  long lVar1;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string str;
  string tag;
  QAM_ am;
  size_type in_stack_fffffffffffffef8;
  array<int,_4UL> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  char *pcVar3;
  allocator *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char (*in_stack_ffffffffffffff88) [6];
  char (*in_stack_ffffffffffffffa0) [2];
  char *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  byte bVar4;
  allocator in_stack_ffffffffffffffb7;
  char *in_stack_ffffffffffffffb8;
  
  args_2 = in_RDI;
  lVar1 = std::__cxx11::string::size();
  bVar4 = 0;
  if (lVar1 == 0) {
    in_stack_ffffffffffffff60 = (allocator *)&stack0xffffffffffffffb7;
    std::allocator<char>::allocator();
    bVar4 = 1;
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,"",in_stack_ffffffffffffff60);
  }
  else {
    std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  }
  if ((bVar4 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  }
  std::array<int,_4UL>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  pcVar3 = amchar;
  pvVar2 = std::array<int,_4UL>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pcVar3 + *pvVar2);
  std::array<int,_4UL>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::array<int,_4UL>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  StringBuilder<char[6],std::__cxx11::string&,char_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (char (*) [2])args_2,(char *)in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8
             ,(char (*) [2])
              CONCAT17(in_stack_ffffffffffffffb7,CONCAT16(bVar4,in_stack_ffffffffffffffb0)),
             in_stack_ffffffffffffffb8);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::__cxx11::string::string((string *)in_RDI,(string *)&stack0xffffffffffffff80);
  }
  else {
    StringBuilder<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (in_RDI,(char (*) [2])in_stack_ffffffffffffff60,args_1);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return args_2;
}

Assistant:

inline std::string ArrVarName(const QAM & tam, const std::string & prefix = "")
{
    auto am = tam.qam;

    std::string tag = (tam.tag.size() ? tam.tag + "_" : "");

    std::string str = StringBuilder("INT__" , tag, amchar[am[0]], "_", 
                                    amchar[am[1]], "_", amchar[am[2]], "_", amchar[am[3]]);
    
    if(prefix.size())
        return StringBuilder(prefix, "_", str);
    else
        return str;
}